

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O0

void __thiscall MetricsDiscovery::MDHelper::~MDHelper(MDHelper *this)

{
  MDHelper *in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  
  if ((in_RDI->m_Activated & 1U) != 0) {
    DeactivateMetricSet(in_RDI);
  }
  if (in_RDI->m_AdapterGroup == (IAdapterGroupLatest *)0x0) {
    if ((in_RDI->CloseMetricsDevice != (CloseMetricsDevice_fn)0x0) &&
       (in_RDI->m_MetricsDevice != (IMetricsDeviceLatest *)0x0)) {
      (*in_RDI->CloseMetricsDevice)(in_RDI->m_MetricsDevice);
      in_RDI->m_MetricsDevice = (IMetricsDeviceLatest *)0x0;
    }
  }
  else {
    if ((in_RDI->m_Adapter != (IAdapterLatest *)0x0) &&
       (in_RDI->m_MetricsDevice != (IMetricsDeviceLatest *)0x0)) {
      (**(code **)(*(long *)in_RDI->m_Adapter + 0x30))(in_RDI->m_Adapter,in_RDI->m_MetricsDevice);
      in_RDI->m_MetricsDevice = (IMetricsDeviceLatest *)0x0;
    }
    (**(code **)(*(long *)in_RDI->m_AdapterGroup + 0x20))();
    in_RDI->m_AdapterGroup = (IAdapterGroupLatest *)0x0;
    in_RDI->m_Adapter = (IAdapterLatest *)0x0;
  }
  in_RDI->m_Initialized = false;
  std::vector<char,_std::allocator<char>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

MDHelper::~MDHelper()
{
    if( m_Activated )
    {
        DeactivateMetricSet();
    }

    if( m_AdapterGroup != NULL )
    {
        if( m_Adapter && m_MetricsDevice )
        {
            m_Adapter->CloseMetricsDevice( m_MetricsDevice );
            m_MetricsDevice = NULL;
        }

        m_AdapterGroup->Close();
        m_AdapterGroup = NULL;
        m_Adapter = NULL;
    }
    else if( CloseMetricsDevice != NULL && m_MetricsDevice )
    {
        CloseMetricsDevice( m_MetricsDevice );
        m_MetricsDevice = NULL;
    }

    m_Initialized = false;
}